

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
WorkSpace::list_kmer_counters_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,WorkSpace *this)

{
  pointer pKVar1;
  KmerCounter *kc;
  pointer pKVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pKVar1 = (this->kmer_counters).super__Vector_base<KmerCounter,_std::allocator<KmerCounter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->kmer_counters).super__Vector_base<KmerCounter,_std::allocator<KmerCounter>_>.
                _M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&pKVar2->name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> WorkSpace::list_kmer_counters() {
    std::vector<std::string> names;
    for (const auto &kc: kmer_counters) {
        names.emplace_back(kc.name);
    }
    return names;
}